

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

void mbedtls_ecp_keypair_free(mbedtls_ecp_keypair *key)

{
  if (key != (mbedtls_ecp_keypair *)0x0) {
    mbedtls_ecp_group_free(&key->grp);
    mbedtls_mpi_free(&key->d);
    mbedtls_mpi_free(&(key->Q).X);
    mbedtls_mpi_free(&(key->Q).Y);
    mbedtls_mpi_free(&(key->Q).Z);
    return;
  }
  return;
}

Assistant:

void mbedtls_ecp_keypair_free(mbedtls_ecp_keypair *key)
{
    if (key == NULL) {
        return;
    }

    mbedtls_ecp_group_free(&key->grp);
    mbedtls_mpi_free(&key->d);
    mbedtls_ecp_point_free(&key->Q);
}